

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceiverPdu.cpp
# Opt level: O2

void __thiscall DIS::ReceiverPdu::ReceiverPdu(ReceiverPdu *this)

{
  RadioCommunicationsFamilyPdu::RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ReceiverPdu_001b1c90;
  *(undefined4 *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2a = 0;
  this->_receivedPower = 0.0;
  EntityID::EntityID(&this->_transmitterEntityId);
  this->_transmitterRadioId = 0;
  Pdu::setPduType((Pdu *)this,'\x1b');
  return;
}

Assistant:

ReceiverPdu::ReceiverPdu() : RadioCommunicationsFamilyPdu(),
   _receiverState(0), 
   _padding1(0), 
   _receivedPower(0.0), 
   _transmitterEntityId(), 
   _transmitterRadioId(0)
{
    setPduType( 27 );
}